

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::CompactReporter::printTotals(CompactReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  pointer pcVar3;
  ostream *poVar4;
  size_t sVar5;
  Colour *this_00;
  Colour colour;
  allocator<char> local_f2;
  allocator<char> local_f1;
  string qualify_assertions_failed;
  string local_d0;
  Colour colour_1;
  Colour colour_2;
  undefined1 local_70 [40];
  undefined1 local_48 [40];
  
  sVar1 = (totals->testCases).failed;
  sVar5 = (totals->testCases).passed + sVar1 + (totals->testCases).failedButOk;
  if (sVar5 == 0) {
    std::operator<<((this->super_StreamingReporterBase).stream,"No tests ran.");
    return;
  }
  if (sVar1 == sVar5) {
    colour.m_moved = false;
    Colour::use(BrightRed);
    sVar1 = (totals->assertions).failed;
    if (sVar1 == (totals->assertions).passed + sVar1 + (totals->assertions).failedButOk) {
      bothOrAll_abi_cxx11_(&qualify_assertions_failed,this,sVar1);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualify_assertions_failed,"",(allocator<char> *)local_48);
    }
    poVar4 = std::operator<<((this->super_StreamingReporterBase).stream,"Failed ");
    bothOrAll_abi_cxx11_(&local_d0,this,(totals->testCases).failed);
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    sVar1 = (totals->testCases).failed;
    std::__cxx11::string::string<std::allocator<char>>((string *)&colour_1,"test case",&local_f2);
    local_48._0_8_ = sVar1;
    std::__cxx11::string::string((string *)(local_48 + 8),(string *)&colour_1);
    operator<<(poVar4,(pluralise *)local_48);
    poVar4 = std::operator<<(poVar4,", failed ");
    poVar4 = std::operator<<(poVar4,(string *)&qualify_assertions_failed);
    pcVar3 = (pointer)(totals->assertions).failed;
    std::__cxx11::string::string<std::allocator<char>>((string *)&colour_2,"assertion",&local_f1);
    local_70._0_8_ = pcVar3;
    std::__cxx11::string::string((string *)(local_70 + 8),(string *)&colour_2);
    operator<<(poVar4,(pluralise *)local_70);
    std::operator<<(poVar4,".");
    std::__cxx11::string::~string((string *)(local_70 + 8));
    std::__cxx11::string::~string((string *)&colour_2);
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::__cxx11::string::~string((string *)&colour_1);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&qualify_assertions_failed);
    this_00 = &colour;
  }
  else {
    sVar1 = (totals->assertions).failed;
    if ((totals->assertions).passed + sVar1 + (totals->assertions).failedButOk == 0) {
      poVar4 = std::operator<<((this->super_StreamingReporterBase).stream,"Passed ");
      bothOrAll_abi_cxx11_
                ((string *)local_70,this,
                 (totals->testCases).failed + (totals->testCases).passed +
                 (totals->testCases).failedButOk);
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      sVar1 = (totals->testCases).passed;
      sVar5 = (totals->testCases).failed;
      sVar2 = (totals->testCases).failedButOk;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualify_assertions_failed,"test case",(allocator<char> *)&local_d0);
      local_48._0_8_ = sVar5 + sVar1 + sVar2;
      std::__cxx11::string::string((string *)(local_48 + 8),(string *)&qualify_assertions_failed);
      operator<<(poVar4,(pluralise *)local_48);
      std::operator<<(poVar4," (no assertions).");
      std::__cxx11::string::~string((string *)(local_48 + 8));
      std::__cxx11::string::~string((string *)&qualify_assertions_failed);
      std::__cxx11::string::~string((string *)local_70);
      return;
    }
    if (sVar1 == 0) {
      colour_2.m_moved = false;
      Colour::use(BrightGreen);
      poVar4 = std::operator<<((this->super_StreamingReporterBase).stream,"Passed ");
      bothOrAll_abi_cxx11_(&qualify_assertions_failed,this,(totals->testCases).passed);
      poVar4 = std::operator<<(poVar4,(string *)&qualify_assertions_failed);
      sVar1 = (totals->testCases).passed;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"test case",(allocator<char> *)&colour);
      local_48._0_8_ = sVar1;
      std::__cxx11::string::string((string *)(local_48 + 8),(string *)&local_d0);
      operator<<(poVar4,(pluralise *)local_48);
      poVar4 = std::operator<<(poVar4," with ");
      pcVar3 = (pointer)(totals->assertions).passed;
      std::__cxx11::string::string<std::allocator<char>>((string *)&colour_1,"assertion",&local_f2);
      local_70._0_8_ = pcVar3;
      std::__cxx11::string::string((string *)(local_70 + 8),(string *)&colour_1);
      operator<<(poVar4,(pluralise *)local_70);
      std::operator<<(poVar4,".");
      std::__cxx11::string::~string((string *)(local_70 + 8));
      std::__cxx11::string::~string((string *)&colour_1);
      std::__cxx11::string::~string((string *)(local_48 + 8));
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&qualify_assertions_failed);
      this_00 = &colour_2;
    }
    else {
      colour_1.m_moved = false;
      Colour::use(BrightRed);
      poVar4 = std::operator<<((this->super_StreamingReporterBase).stream,"Failed ");
      sVar1 = (totals->testCases).failed;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualify_assertions_failed,"test case",(allocator<char> *)&colour_2);
      local_48._0_8_ = sVar1;
      std::__cxx11::string::string((string *)(local_48 + 8),(string *)&qualify_assertions_failed);
      operator<<(poVar4,(pluralise *)local_48);
      poVar4 = std::operator<<(poVar4,", failed ");
      pcVar3 = (pointer)(totals->assertions).failed;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"assertion",(allocator<char> *)&colour);
      local_70._0_8_ = pcVar3;
      std::__cxx11::string::string((string *)(local_70 + 8),(string *)&local_d0);
      operator<<(poVar4,(pluralise *)local_70);
      std::operator<<(poVar4,".");
      std::__cxx11::string::~string((string *)(local_70 + 8));
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)(local_48 + 8));
      std::__cxx11::string::~string((string *)&qualify_assertions_failed);
      this_00 = &colour_1;
    }
  }
  Colour::~Colour(this_00);
  return;
}

Assistant:

void printTotals( const Totals& totals ) const {
            if( totals.testCases.total() == 0 ) {
                stream << "No tests ran.";
            }
            else if( totals.testCases.failed == totals.testCases.total() ) {
                Colour colour( Colour::ResultError );
                const std::string qualify_assertions_failed =
                    totals.assertions.failed == totals.assertions.total() ?
                        bothOrAll( totals.assertions.failed ) : "";
                stream <<
                    "Failed " << bothOrAll( totals.testCases.failed )
                              << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << qualify_assertions_failed <<
                                 pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else if( totals.assertions.total() == 0 ) {
                stream <<
                    "Passed " << bothOrAll( totals.testCases.total() )
                              << pluralise( totals.testCases.total(), "test case" )
                              << " (no assertions).";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                stream <<
                    "Failed " << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream <<
                    "Passed " << bothOrAll( totals.testCases.passed )
                              << pluralise( totals.testCases.passed, "test case"  ) <<
                    " with "  << pluralise( totals.assertions.passed, "assertion" ) << ".";
            }
        }